

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer.cc
# Opt level: O0

void prometheus::anon_unknown_5::SerializeFamily(ostream *out,MetricFamily *family)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  reference pCVar4;
  ClientMetric *metric_5;
  const_iterator __end3_5;
  const_iterator __begin3_5;
  vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_> *__range3_5;
  ClientMetric *metric_4;
  const_iterator __end3_4;
  const_iterator __begin3_4;
  vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_> *__range3_4;
  ClientMetric *metric_3;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_> *__range3_3;
  ClientMetric *metric_2;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_> *__range3_2;
  ClientMetric *metric_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_> *__range3_1;
  ClientMetric *metric;
  const_iterator __end3;
  const_iterator __begin3;
  vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_> *__range3;
  MetricFamily *family_local;
  ostream *out_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<(out,"# HELP ");
    poVar3 = std::operator<<(poVar3,(string *)family);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,(string *)&family->help);
    std::operator<<(poVar3,"\n");
  }
  switch(family->type) {
  case Counter:
    poVar3 = std::operator<<(out,"# TYPE ");
    poVar3 = std::operator<<(poVar3,(string *)family);
    std::operator<<(poVar3," counter\n");
    __end3 = std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::begin
                       (&family->metric);
    metric = (ClientMetric *)
             std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::end
                       (&family->metric);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_prometheus::ClientMetric_*,_std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>_>
                                       *)&metric), bVar1) {
      pCVar4 = __gnu_cxx::
               __normal_iterator<const_prometheus::ClientMetric_*,_std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>_>
               ::operator*(&__end3);
      SerializeCounter(out,family,pCVar4);
      __gnu_cxx::
      __normal_iterator<const_prometheus::ClientMetric_*,_std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>_>
      ::operator++(&__end3);
    }
    break;
  case Gauge:
    poVar3 = std::operator<<(out,"# TYPE ");
    poVar3 = std::operator<<(poVar3,(string *)family);
    std::operator<<(poVar3," gauge\n");
    __end3_1 = std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::
               begin(&family->metric);
    metric_1 = (ClientMetric *)
               std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::end
                         (&family->metric);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<const_prometheus::ClientMetric_*,_std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>_>
                               *)&metric_1), bVar1) {
      pCVar4 = __gnu_cxx::
               __normal_iterator<const_prometheus::ClientMetric_*,_std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>_>
               ::operator*(&__end3_1);
      SerializeGauge(out,family,pCVar4);
      __gnu_cxx::
      __normal_iterator<const_prometheus::ClientMetric_*,_std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>_>
      ::operator++(&__end3_1);
    }
    break;
  case Summary:
    poVar3 = std::operator<<(out,"# TYPE ");
    poVar3 = std::operator<<(poVar3,(string *)family);
    std::operator<<(poVar3," summary\n");
    __end3_3 = std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::
               begin(&family->metric);
    metric_3 = (ClientMetric *)
               std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::end
                         (&family->metric);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_3,
                              (__normal_iterator<const_prometheus::ClientMetric_*,_std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>_>
                               *)&metric_3), bVar1) {
      pCVar4 = __gnu_cxx::
               __normal_iterator<const_prometheus::ClientMetric_*,_std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>_>
               ::operator*(&__end3_3);
      SerializeSummary(out,family,pCVar4);
      __gnu_cxx::
      __normal_iterator<const_prometheus::ClientMetric_*,_std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>_>
      ::operator++(&__end3_3);
    }
    break;
  case Untyped:
    poVar3 = std::operator<<(out,"# TYPE ");
    poVar3 = std::operator<<(poVar3,(string *)family);
    std::operator<<(poVar3," untyped\n");
    __end3_4 = std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::
               begin(&family->metric);
    metric_4 = (ClientMetric *)
               std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::end
                         (&family->metric);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_4,
                              (__normal_iterator<const_prometheus::ClientMetric_*,_std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>_>
                               *)&metric_4), bVar1) {
      pCVar4 = __gnu_cxx::
               __normal_iterator<const_prometheus::ClientMetric_*,_std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>_>
               ::operator*(&__end3_4);
      SerializeUntyped(out,family,pCVar4);
      __gnu_cxx::
      __normal_iterator<const_prometheus::ClientMetric_*,_std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>_>
      ::operator++(&__end3_4);
    }
    break;
  case Histogram:
    poVar3 = std::operator<<(out,"# TYPE ");
    poVar3 = std::operator<<(poVar3,(string *)family);
    std::operator<<(poVar3," histogram\n");
    __end3_5 = std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::
               begin(&family->metric);
    metric_5 = (ClientMetric *)
               std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::end
                         (&family->metric);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_5,
                              (__normal_iterator<const_prometheus::ClientMetric_*,_std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>_>
                               *)&metric_5), bVar1) {
      pCVar4 = __gnu_cxx::
               __normal_iterator<const_prometheus::ClientMetric_*,_std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>_>
               ::operator*(&__end3_5);
      SerializeHistogram(out,family,pCVar4);
      __gnu_cxx::
      __normal_iterator<const_prometheus::ClientMetric_*,_std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>_>
      ::operator++(&__end3_5);
    }
    break;
  case Info:
    poVar3 = std::operator<<(out,"# TYPE ");
    poVar3 = std::operator<<(poVar3,(string *)family);
    std::operator<<(poVar3," gauge\n");
    __end3_2 = std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::
               begin(&family->metric);
    metric_2 = (ClientMetric *)
               std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::end
                         (&family->metric);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_2,
                              (__normal_iterator<const_prometheus::ClientMetric_*,_std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>_>
                               *)&metric_2), bVar1) {
      pCVar4 = __gnu_cxx::
               __normal_iterator<const_prometheus::ClientMetric_*,_std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>_>
               ::operator*(&__end3_2);
      SerializeInfo(out,family,pCVar4);
      __gnu_cxx::
      __normal_iterator<const_prometheus::ClientMetric_*,_std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>_>
      ::operator++(&__end3_2);
    }
  }
  return;
}

Assistant:

void SerializeFamily(std::ostream& out, const MetricFamily& family) {
  if (!family.help.empty()) {
    out << "# HELP " << family.name << " " << family.help << "\n";
  }
  switch (family.type) {
    case MetricType::Counter:
      out << "# TYPE " << family.name << " counter\n";
      for (auto& metric : family.metric) {
        SerializeCounter(out, family, metric);
      }
      break;
    case MetricType::Gauge:
      out << "# TYPE " << family.name << " gauge\n";
      for (auto& metric : family.metric) {
        SerializeGauge(out, family, metric);
      }
      break;
    // info is not handled by prometheus, we use gauge as workaround
    // (https://github.com/OpenObservability/OpenMetrics/blob/98ae26c87b1c3bcf937909a880b32c8be643cc9b/specification/OpenMetrics.md#info-1)
    case MetricType::Info:
      out << "# TYPE " << family.name << " gauge\n";
      for (auto& metric : family.metric) {
        SerializeInfo(out, family, metric);
      }
      break;
    case MetricType::Summary:
      out << "# TYPE " << family.name << " summary\n";
      for (auto& metric : family.metric) {
        SerializeSummary(out, family, metric);
      }
      break;
    case MetricType::Untyped:
      out << "# TYPE " << family.name << " untyped\n";
      for (auto& metric : family.metric) {
        SerializeUntyped(out, family, metric);
      }
      break;
    case MetricType::Histogram:
      out << "# TYPE " << family.name << " histogram\n";
      for (auto& metric : family.metric) {
        SerializeHistogram(out, family, metric);
      }
      break;
  }
}